

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getClientAddress
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_httpreq_ext *pvVar2;
  vm_val_t *in_RDX;
  CVmRun *in_RDI;
  TadsServerThread *t;
  TadsHttpRequest *req;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  int32_t intval;
  vm_val_t *in_stack_ffffffffffffffb8;
  TadsHttpServerThread *this_00;
  CVmRun *this_01;
  uint in_stack_ffffffffffffffcc;
  uchar **in_stack_ffffffffffffffd0;
  
  if ((getp_getClientAddress(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getClientAddress(unsigned_int,vm_val_t*,unsigned_int*)::desc
                                 ), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getClientAddress::desc,0);
    __cxa_guard_release(&getp_getClientAddress(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,(uint *)in_RDI,in_stack_ffffffffffffffa8);
  intval = (int32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (iVar1 == 0) {
    pvVar2 = get_ext((CVmObjHTTPRequest *)in_RDI);
    this_01 = (CVmRun *)pvVar2->req;
    this_00 = *(TadsHttpServerThread **)&this_01->profiling_;
    TadsServerThread::get_client_port(&this_00->super_TadsServerThread);
    CVmRun::push_int(in_RDI,intval);
    TadsServerThread::get_client_ip(&this_00->super_TadsServerThread);
    CVmRun::push_string(this_01,(char *)this_00);
    obj = CVmObjList::create_from_stack(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    vm_val_t::set_obj(in_RDX,obj);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getClientAddress(VMG_ vm_obj_id_t self,
                                             vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsServerThread *t = req->thread;

    /* set up the return list, using address information from the thread */
    G_interpreter->push_int(vmg_ t->get_client_port());
    G_interpreter->push_string(vmg_ t->get_client_ip());
    retval->set_obj(CVmObjList::create_from_stack(vmg_ 0, 2));
    
    /* handled */
    return TRUE;
}